

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

PixOrCopyBlock * BackwardRefsNewBlock(VP8LBackwardRefs *refs)

{
  PixOrCopyBlock *pPVar1;
  
  pPVar1 = refs->free_blocks_;
  if (pPVar1 == (PixOrCopyBlock *)0x0) {
    pPVar1 = (PixOrCopyBlock *)WebPSafeMalloc(1,(long)refs->block_size_ * 8 + 0x18);
    if (pPVar1 == (PixOrCopyBlock *)0x0) {
      *(byte *)&refs->error_ = (byte)refs->error_ | 1;
      return (PixOrCopyBlock *)0x0;
    }
    pPVar1->start_ = (PixOrCopy *)(pPVar1 + 1);
  }
  else {
    refs->free_blocks_ = pPVar1->next_;
  }
  *refs->tail_ = pPVar1;
  refs->tail_ = &pPVar1->next_;
  refs->last_block_ = pPVar1;
  pPVar1->next_ = (PixOrCopyBlock *)0x0;
  pPVar1->size_ = 0;
  return pPVar1;
}

Assistant:

static PixOrCopyBlock* BackwardRefsNewBlock(VP8LBackwardRefs* const refs) {
  PixOrCopyBlock* b = refs->free_blocks_;
  if (b == NULL) {   // allocate new memory chunk
    const size_t total_size =
        sizeof(*b) + refs->block_size_ * sizeof(*b->start_);
    b = (PixOrCopyBlock*)WebPSafeMalloc(1ULL, total_size);
    if (b == NULL) {
      refs->error_ |= 1;
      return NULL;
    }
    b->start_ = (PixOrCopy*)((uint8_t*)b + sizeof(*b));  // not always aligned
  } else {  // recycle from free-list
    refs->free_blocks_ = b->next_;
  }
  *refs->tail_ = b;
  refs->tail_ = &b->next_;
  refs->last_block_ = b;
  b->next_ = NULL;
  b->size_ = 0;
  return b;
}